

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::CostAttributes::initializeCost
          (CostAttributes *this,IndexRange *selectedRange,uint totalDimension)

{
  uint *in_RSI;
  IndexRange *in_RDI;
  uint rangeSize;
  uint in_stack_00000118;
  uint in_stack_0000011c;
  CostAttributes *in_stack_00000120;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  std::
  make_shared<iDynTree::optimalcontrol::IndexSelector,iDynTree::IndexRange_const&,unsigned_int&>
            (in_RDI,in_RSI);
  std::shared_ptr<iDynTree::optimalcontrol::Selector>::operator=
            ((shared_ptr<iDynTree::optimalcontrol::Selector> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (shared_ptr<iDynTree::optimalcontrol::IndexSelector> *)in_RDI);
  std::shared_ptr<iDynTree::optimalcontrol::IndexSelector>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::IndexSelector> *)0x34cdee);
  initializeBuffers(in_stack_00000120,in_stack_0000011c,in_stack_00000118);
  return;
}

Assistant:

void initializeCost(const IndexRange& selectedRange, unsigned int totalDimension) {
                this->selector = std::make_shared<IndexSelector>(selectedRange, totalDimension);
                unsigned int rangeSize = static_cast<unsigned int>(selectedRange.size);
                initializeBuffers(rangeSize, totalDimension);
            }